

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printTree(Node *node,int space)

{
  pointer pNVar1;
  ostream *poVar2;
  int iVar3;
  pointer node_00;
  nodekind local_6c;
  Node local_68;
  
  iVar3 = 0;
  if (0 < space) {
    iVar3 = space;
  }
  while (iVar3 != 0) {
    std::operator<<((ostream *)&std::cout," ");
    iVar3 = iVar3 + -1;
  }
  local_6c = node->kind;
  poVar2 = operator<<((ostream *)&std::cout,&local_6c);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)&node->value);
  std::endl<char,std::char_traits<char>>(poVar2);
  pNVar1 = (node->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (node_00 = (node->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start; node_00 != pNVar1; node_00 = node_00 + 1) {
    Node::Node(&local_68,node_00);
    printTree(&local_68,space + 5);
    Node::~Node(&local_68);
  }
  return;
}

Assistant:

void printTree(Node node, int space) {
    for (int i = 0; i < space; i++) {
        cout << " ";
    }
    cout << node.getKind() << " " << node.value << endl;
    for (const auto &n : node.subnodes) {
        printTree(n, space + 5);
    }
}